

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::dht_tracker::connection_timeout
          (dht_tracker *this,listen_socket_handle *s,error_code *e)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  time_duration d;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
  local_50;
  duration local_20;
  
  if (((e->failed_ == false) && (this->m_running == true)) &&
     (p_Var5 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var5 != (_Base_ptr)0x0)) {
    p_Var2 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (_Base_ptr)
             (s->m_sock).
             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    p_Var6 = &p_Var2->_M_header;
    do {
      bVar7 = p_Var5[1]._M_parent < p_Var3;
      if (!bVar7) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar7];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var2) && (p_Var6[1]._M_parent <= p_Var3)) {
      local_20.__r = (rep)dht::node::connection_timeout((node *)&p_Var6[1]._M_left);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)&p_Var6[0x16]._M_left,&local_20);
      ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::dht::dht_tracker,void>
                ((__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
      local_50._M_f = (offset_in_dht_tracker_to_subr)connection_timeout;
      local_50._8_8_ = 0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
      .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
      super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (s->m_sock).
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
      .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
      super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (s->m_sock).
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_50._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
          .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
          super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
          super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
           .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
           super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count =
               (local_50._M_bound_args.
                super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                .
                super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.
                m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          (local_50._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
           .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
           super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count =
               (local_50._M_bound_args.
                super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                .
                super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.
                m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count + 1;
        }
      }
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68
      ;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Stack_60;
      local_68 = (element_type *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::detail::
      deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
      ::
      async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                  *)p_Var6[0x16]._M_left,(implementation_type *)&p_Var6[0x16]._M_right,&local_50,
                 (any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&p_Var6[0x18]._M_left);
      if (local_50._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
          .super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>._M_head_impl.
          super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                   .super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>.
                   _M_head_impl.
                   super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_50._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
          .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
          super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
          super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_50._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                     .
                     super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                     .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>.
                     _M_head_impl.m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = (local_50._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                   .
                   super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                   .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl
                   .m_sock.
                   super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_50._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
           .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
           super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(local_50._M_bound_args.
             super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
             .super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
             super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock
             .super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
    }
  }
  return;
}

Assistant:

void dht_tracker::connection_timeout(aux::listen_socket_handle const& s, error_code const& e)
	{
		COMPLETE_ASYNC("dht_tracker::connection_timeout");
		if (e || !m_running) return;

		auto const it = m_nodes.find(s);
		// this could happen if the task is about to be executed (and not cancellable) and
		// the socket is just removed
		if (it == m_nodes.end()) return; // node already destroyed

		tracker_node& n = it->second;
		time_duration const d = n.dht.connection_timeout();
		aux::deadline_timer& timer = n.connection_timer;
		timer.expires_after(d);
		ADD_OUTSTANDING_ASYNC("dht_tracker::connection_timeout");
		timer.async_wait(std::bind(&dht_tracker::connection_timeout, self(), s, _1));
	}